

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

void __thiscall
PhyloTree::getEdgesNotInCommonWith
          (PhyloTree *this,PhyloTree *t,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *dest)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  PhyloTreeEdge *pPVar1;
  pointer pPVar2;
  bool bVar3;
  bool bVar4;
  runtime_error *this_00;
  PhyloTreeEdge *that_edge;
  pointer other;
  PhyloTreeEdge *this_edge;
  PhyloTreeEdge *this_01;
  
  __first1 = (this->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  __last1 = (this->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __first2 = (t->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (((long)__last1 - (long)__first1 !=
       (long)(t->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) ||
     (bVar3 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (__first1,__last1,__first2), !bVar3)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"leaf2NumMaps are not equal");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar1 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (this_01 == pPVar1) {
      return;
    }
    other = (t->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
            super__Vector_impl_data._M_start;
    pPVar2 = (t->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (other == pPVar2) {
LAB_00120e0d:
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(dest,this_01);
    }
    else {
      bVar3 = true;
      do {
        bVar4 = PhyloTreeEdge::sameBipartition(this_01,other);
        if (bVar4) {
          bVar3 = false;
        }
        other = other + 1;
      } while (other != pPVar2);
      if (bVar3) goto LAB_00120e0d;
    }
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

void PhyloTree::getEdgesNotInCommonWith(PhyloTree &t, vector<PhyloTreeEdge>& dest) {
    bool not_common;
    if (leaf2NumMap != t.leaf2NumMap) {
        throw runtime_error("leaf2NumMaps are not equal");
    }
    for (auto &this_edge : edges) {
        not_common = true;
        //if (this_edge.isZero()) continue;

        for (auto &that_edge : t.edges) {
            //if (that_edge.isZero()) continue;
            if (this_edge.sameBipartition(that_edge)) {
                not_common = false;
            }
        }
        if (not_common)
            dest.push_back(this_edge);
    }
}